

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmdisubwindow.cpp
# Opt level: O2

void __thiscall
QMdiSubWindowPrivate::setActive(QMdiSubWindowPrivate *this,bool activate,bool changeFocus)

{
  long lVar1;
  QWidget *this_00;
  QWidgetData *pQVar2;
  byte bVar3;
  bool bVar4;
  WindowStates WVar5;
  WindowStates WVar6;
  int iVar7;
  int iVar8;
  QMenuBar *menuBar;
  QWidget *pQVar9;
  QStyle *pQVar10;
  QWidget *this_01;
  long in_FS_OFFSET;
  QRegion QStack_48;
  QRegion windowDecoration;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(long *)&(this->super_QWidgetPrivate).field_0x10 == 0) || (this->activationEnabled != true))
  goto LAB_00417190;
  this_00 = *(QWidget **)&(this->super_QWidgetPrivate).field_0x8;
  bVar3 = this->isActive;
  if (activate) {
    if (((bool)bVar3 == false) && ((this_00->data->widget_attributes & 1) == 0)) {
      this->isActive = true;
      this->isExplicitlyDeactivated = false;
      WVar5 = QWidget::windowState(this_00);
      ensureWindowState(this,WindowActive);
      QMdiSubWindow::aboutToActivate((QMdiSubWindow *)this_00);
      menuBar = QMdiSubWindowPrivate::menuBar(this);
      if (menuBar != (QMenuBar *)0x0) {
        showButtonsInMenuBar(this,menuBar);
      }
      WVar6 = QWidget::windowState(this_00);
      QMdiSubWindow::windowStateChanged((QMdiSubWindow *)this_00,WVar5,WVar6);
      bVar3 = this->isActive;
    }
    if (((bVar3 & 1) != 0) && ((this_00->data->widget_attributes & 1) == 0)) {
      bVar4 = QWidget::hasFocus(this_00);
      if (!bVar4) {
        pQVar9 = QApplication::focusWidget();
        bVar4 = QWidget::isAncestorOf(this_00,pQVar9);
        if (!bVar4) {
          if (changeFocus) {
            setFocusWidget(this);
          }
          ensureWindowState(this,WindowActive);
        }
      }
    }
  }
  else if ((bool)bVar3 != false) {
    this->isActive = false;
    WVar5 = QWidget::windowState(this_00);
    WVar6 = QWidget::windowState(this_00);
    QWidget::overrideWindowState
              (this_00,(WindowStates)
                       ((uint)WVar6.super_QFlagsStorageHelper<Qt::WindowState,_4>.
                              super_QFlagsStorage<Qt::WindowState>.i & 0xfffffff7));
    if (changeFocus) {
      storeFocusWidget(this);
      pQVar9 = QApplication::focusWidget();
      if (pQVar9 != (QWidget *)0x0) {
        if (pQVar9 != this_00) {
          bVar4 = QWidget::isAncestorOf(this_00,pQVar9);
          if (!bVar4) goto LAB_00417058;
        }
        QWidget::clearFocus(pQVar9);
      }
    }
LAB_00417058:
    bVar4 = QPointer::operator_cast_to_bool((QPointer *)&this->baseWidget);
    if (bVar4) {
      pQVar9 = (QWidget *)(this->baseWidget).wp.value;
      this_01 = (QWidget *)0x0;
      if (*(int *)((this->baseWidget).wp.d + 4) != 0) {
        this_01 = pQVar9;
      }
      WVar6 = QWidget::windowState(pQVar9);
      QWidget::overrideWindowState
                (this_01,(WindowStates)
                         ((uint)WVar6.super_QFlagsStorageHelper<Qt::WindowState,_4>.
                                super_QFlagsStorage<Qt::WindowState>.i & 0xfffffff7));
    }
    WVar6 = QWidget::windowState(this_00);
    QMdiSubWindow::windowStateChanged((QMdiSubWindow *)this_00,WVar5,WVar6);
  }
  pQVar10 = QWidget::style(this_00);
  iVar7 = (**(code **)(*(long *)pQVar10 + 0xe0))(pQVar10,0x2c,0,this_00);
  iVar8 = titleBarHeight(this);
  windowDecoration.d = (QRegionData *)&DAT_aaaaaaaaaaaaaaaa;
  pQVar2 = this_00->data;
  QRegion::QRegion(&windowDecoration,0,0,((pQVar2->crect).x2.m_i - (pQVar2->crect).x1.m_i) + 1,
                   ((pQVar2->crect).y2.m_i - (pQVar2->crect).y1.m_i) + 1,Rectangle);
  pQVar2 = this_00->data;
  QRegion::QRegion(&QStack_48,iVar7,iVar8,
                   (((pQVar2->crect).x2.m_i + iVar7 * -2) - (pQVar2->crect).x1.m_i) + 1,
                   ((pQVar2->crect).y2.m_i - (iVar7 + iVar8 + (pQVar2->crect).y1.m_i)) + 1,Rectangle
                  );
  QRegion::operator-=(&windowDecoration,&QStack_48);
  QRegion::~QRegion(&QStack_48);
  if ((this->resizeTimer).m_id != Invalid) {
    QBasicTimer::stop();
    updateDirtyRegions(this);
  }
  QWidget::update(this_00,&windowDecoration);
  QRegion::~QRegion(&windowDecoration);
LAB_00417190:
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QMdiSubWindowPrivate::setActive(bool activate, bool changeFocus)
{
    Q_Q(QMdiSubWindow);
    if (!parent || !activationEnabled)
        return;

    if (activate && !isActive && q->isEnabled()) {
        isActive = true;
        isExplicitlyDeactivated = false;
        Qt::WindowStates oldWindowState = q->windowState();
        ensureWindowState(Qt::WindowActive);
        emit q->aboutToActivate();
#if QT_CONFIG(menubar)
        if (QMenuBar *mBar = menuBar())
            showButtonsInMenuBar(mBar);
#endif
        Q_ASSERT(isActive);
        emit q->windowStateChanged(oldWindowState, q->windowState());
    } else if (!activate && isActive) {
        isActive = false;
        Qt::WindowStates oldWindowState = q->windowState();
        q->overrideWindowState(q->windowState() & ~Qt::WindowActive);
        if (changeFocus) {
            storeFocusWidget();
            QWidget *focusWidget = QApplication::focusWidget();
            if (focusWidget && (focusWidget == q || q->isAncestorOf(focusWidget)))
                focusWidget->clearFocus();
        }
        if (baseWidget)
            baseWidget->overrideWindowState(baseWidget->windowState() & ~Qt::WindowActive);
        Q_ASSERT(!isActive);
        emit q->windowStateChanged(oldWindowState, q->windowState());
    }

    if (activate && isActive && q->isEnabled() && !q->hasFocus()
            && !q->isAncestorOf(QApplication::focusWidget())) {
        if (changeFocus)
            setFocusWidget();
        ensureWindowState(Qt::WindowActive);
    }

    int frameWidth = q->style()->pixelMetric(QStyle::PM_MdiSubWindowFrameWidth, nullptr, q);
    int titleBarHeight = this->titleBarHeight();
    QRegion windowDecoration = QRegion(0, 0, q->width(), q->height());
    windowDecoration -= QRegion(frameWidth, titleBarHeight, q->width() - 2 * frameWidth,
                                q->height() - titleBarHeight - frameWidth);

    // Make sure we don't use cached style options if we get
    // resize events right before activation/deactivation.
    if (resizeTimer.isActive()) {
        resizeTimer.stop();
        updateDirtyRegions();
    }

    q->update(windowDecoration);
}